

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectBlur.cpp
# Opt level: O0

void __thiscall Rml::FontEffectBlurInstancer::FontEffectBlurInstancer(FontEffectBlurInstancer *this)

{
  PropertyId PVar1;
  PropertyDefinition *pPVar2;
  allocator<char> local_1a9;
  String local_1a8;
  allocator<char> local_181;
  String local_180;
  allocator<char> local_159;
  String local_158;
  allocator<char> local_131;
  String local_130;
  allocator<char> local_109;
  String local_108;
  allocator<char> local_e1;
  String local_e0;
  allocator<char> local_b9;
  String local_b8;
  allocator<char> local_91;
  String local_90;
  allocator<char> local_69;
  String local_68;
  allocator<char> local_31;
  String local_30;
  FontEffectBlurInstancer *local_10;
  FontEffectBlurInstancer *this_local;
  
  local_10 = this;
  FontEffectInstancer::FontEffectInstancer(&this->super_FontEffectInstancer);
  (this->super_FontEffectInstancer)._vptr_FontEffectInstancer =
       (_func_int **)&PTR__FontEffectBlurInstancer_008179c0;
  this->id_width = Invalid;
  this->id_color = Invalid;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"width",&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"1px",&local_69);
  pPVar2 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_30,&local_68,true);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"length",&local_91);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_b9);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_90,&local_b8);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  this->id_width = PVar1;
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::allocator<char>::~allocator(&local_b9);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::allocator<char>::~allocator(&local_91);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::allocator<char>::~allocator(&local_69);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator(&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"color",&local_e1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"white",&local_109);
  pPVar2 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_e0,&local_108,false);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"color",&local_131);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"",&local_159);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_130,&local_158);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  this->id_color = PVar1;
  ::std::__cxx11::string::~string((string *)&local_158);
  ::std::allocator<char>::~allocator(&local_159);
  ::std::__cxx11::string::~string((string *)&local_130);
  ::std::allocator<char>::~allocator(&local_131);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::allocator<char>::~allocator(&local_109);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::allocator<char>::~allocator(&local_e1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"font-effect",&local_181);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"width, color",&local_1a9);
  FontEffectInstancer::RegisterShorthand
            (&this->super_FontEffectInstancer,&local_180,&local_1a8,FallThrough);
  ::std::__cxx11::string::~string((string *)&local_1a8);
  ::std::allocator<char>::~allocator(&local_1a9);
  ::std::__cxx11::string::~string((string *)&local_180);
  ::std::allocator<char>::~allocator(&local_181);
  return;
}

Assistant:

FontEffectBlurInstancer::FontEffectBlurInstancer() : id_width(PropertyId::Invalid), id_color(PropertyId::Invalid)
{
	id_width = RegisterProperty("width", "1px", true).AddParser("length").GetId();
	id_color = RegisterProperty("color", "white", false).AddParser("color").GetId();
	RegisterShorthand("font-effect", "width, color", ShorthandType::FallThrough);
}